

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O0

void __thiscall
ExprAssignment::ExprAssignment
          (ExprAssignment *this,SynBase *source,TypeBase *type,ExprBase *lhs,ExprBase *rhs)

{
  bool bVar1;
  TypeRef *pTVar2;
  TypeRef *refType;
  ExprBase *rhs_local;
  ExprBase *lhs_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExprAssignment *this_local;
  
  ExprBase::ExprBase(&this->super_ExprBase,0x19,source,type);
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprAssignment_0052bdd8;
  this->lhs = lhs;
  this->rhs = rhs;
  bVar1 = isType<TypeError>(type);
  if (!bVar1) {
    pTVar2 = getType<TypeRef>(lhs->type);
    if (pTVar2 == (TypeRef *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                    ,0x32e,
                    "ExprAssignment::ExprAssignment(SynBase *, TypeBase *, ExprBase *, ExprBase *)")
      ;
    }
    if (pTVar2->subType != rhs->type) {
      __assert_fail("refType->subType == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                    ,0x32f,
                    "ExprAssignment::ExprAssignment(SynBase *, TypeBase *, ExprBase *, ExprBase *)")
      ;
    }
  }
  return;
}

Assistant:

ExprAssignment(SynBase *source, TypeBase *type, ExprBase *lhs, ExprBase *rhs): ExprBase(myTypeID, source, type), lhs(lhs), rhs(rhs)
	{
		if(!isType<TypeError>(type))
		{
			TypeRef *refType = getType<TypeRef>(lhs->type);

			(void)refType;
			assert(refType);
			assert(refType->subType == rhs->type);
		}
	}